

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::MultiPartOutputFile::Data::writeHeadersToFile
          (Data *this,vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers)

{
  pointer pHVar1;
  __type isTiled;
  string *__lhs;
  uint64_t uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    pHVar1 = (headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pHVar1;
    if ((ulong)(lVar3 / 0x38) <= uVar4) break;
    __lhs = Header::type_abi_cxx11_((Header *)((long)&(pHVar1->_map)._M_t._M_impl + lVar5));
    isTiled = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)TILEDIMAGE_abi_cxx11_);
    uVar2 = Header::writeTo((Header *)
                            ((long)&(((headers->
                                      super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                    _M_impl + lVar5),(this->super_OutputStreamMutex).os,isTiled);
    (this->parts).
    super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar4]->previewPosition = uVar2;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x38;
  }
  if (lVar3 == 0x38) {
    return;
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>((this->super_OutputStreamMutex).os,"");
  return;
}

Assistant:

void
MultiPartOutputFile::Data::writeHeadersToFile (const vector<Header>& headers)
{
    for (size_t i = 0; i < headers.size (); i++)
    {

        // (TODO) consider deep files' preview images here.
        if (headers[i].type () == TILEDIMAGE)
            parts[i]->previewPosition = headers[i].writeTo (*os, true);
        else
            parts[i]->previewPosition = headers[i].writeTo (*os, false);
    }

    //
    // If a multipart file, write zero-length attribute name to mark the end of all headers.
    //

    if (headers.size () != 1)
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*os, "");
}